

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imsg-buffer.c
# Opt level: O0

int ibuf_write(msgbuf *msgbuf)

{
  ssize_t sVar1;
  int *piVar2;
  long *in_RDI;
  ssize_t n;
  uint i;
  ibuf *buf;
  iovec iov [1024];
  undefined4 in_stack_ffffffffffffbfd8;
  uint __count;
  ibuf *msgbuf_00;
  iovec local_4018 [1024];
  long *local_10;
  
  __count = 0;
  local_10 = in_RDI;
  memset(local_4018,0,0x4000);
  msgbuf_00 = (ibuf *)*local_10;
  for (; (msgbuf_00 != (ibuf *)0x0 && (__count < 0x400)); __count = __count + 1) {
    local_4018[__count].iov_base = (void *)(msgbuf_00->rpos + (long)msgbuf_00->buf);
    local_4018[__count].iov_len = msgbuf_00->wpos - msgbuf_00->rpos;
    msgbuf_00 = ((anon_struct_16_2_f6afc105_for_bufs *)&msgbuf_00->entry)->tqh_first;
  }
  do {
    sVar1 = writev(*(int *)((long)local_10 + 0x14),local_4018,__count);
    if (sVar1 != -1) {
      if (sVar1 == 0) {
        piVar2 = __errno_location();
        *piVar2 = 0;
        return 0;
      }
      msgbuf_drain((msgbuf *)msgbuf_00,CONCAT44(__count,in_stack_ffffffffffffbfd8));
      return 1;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  piVar2 = __errno_location();
  if (*piVar2 == 0x69) {
    piVar2 = __errno_location();
    *piVar2 = 0xb;
  }
  return -1;
}

Assistant:

int
ibuf_write(struct msgbuf *msgbuf)
{
	struct iovec	 iov[IOV_MAX];
	struct ibuf	*buf;
	unsigned int	 i = 0;
	ssize_t	n;

	bzero(&iov, sizeof(iov));
	TAILQ_FOREACH(buf, &msgbuf->bufs, entry) {
		if (i >= IOV_MAX)
			break;
		iov[i].iov_base = buf->buf + buf->rpos;
		iov[i].iov_len = buf->wpos - buf->rpos;
		i++;
	}

again:
	if ((n = writev(msgbuf->fd, iov, i)) == -1) {
		if (errno == EINTR)
			goto again;
		if (errno == ENOBUFS)
			errno = EAGAIN;
		return (-1);
	}

	if (n == 0) {			/* connection closed */
		errno = 0;
		return (0);
	}

	msgbuf_drain(msgbuf, n);

	return (1);
}